

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portfwd.c
# Opt level: O3

Channel * portfwd_raw_new(ConnectionLayer *cl,Plug **plug,_Bool start_ready)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)safemalloc(1,0x58,0);
  puVar1[6] = 0;
  puVar1[8] = &PortForwarding_plugvt;
  *(undefined4 *)(puVar1 + 10) = 0;
  puVar1[9] = &PortForwarding_channelvt;
  *puVar1 = 0;
  puVar1[1] = cl;
  *(undefined1 *)(puVar1 + 3) = 1;
  *(_Bool *)((long)puVar1 + 0x19) = start_ready;
  *(undefined8 *)((long)puVar1 + 0x1c) = 0;
  *(undefined8 *)((long)puVar1 + 0x24) = 0;
  *plug = (Plug *)(puVar1 + 8);
  return (Channel *)(puVar1 + 9);
}

Assistant:

Channel *portfwd_raw_new(ConnectionLayer *cl, Plug **plug, bool start_ready)
{
    struct PortForwarding *pf;

    pf = new_portfwd_state();
    pf->plug.vt = &PortForwarding_plugvt;
    pf->chan.initial_fixed_window_size = 0;
    pf->chan.vt = &PortForwarding_channelvt;
    pf->input_wanted = true;

    pf->c = NULL;

    pf->cl = cl;
    pf->input_wanted = true;
    pf->ready = start_ready;

    pf->socks_state = SOCKS_NONE;
    pf->hostname = NULL;
    pf->port = 0;

    *plug = &pf->plug;
    return &pf->chan;
}